

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O3

ImageFormat __thiscall spv::Builder::getImageTypeFormat(Builder *this,Id typeId)

{
  Instruction *pIVar1;
  
  pIVar1 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[typeId];
  if ((**(byte **)&(pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data & 0x40) == 0) {
    return *(ImageFormat *)
            (*(long *)&(pIVar1->operands).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data + 0x18);
  }
  __assert_fail("!idOperand[op]",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
}

Assistant:

Instruction* getInstruction(Id id) const { return idToInstruction[id]; }